

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::timerEvent(QTreeView *this,QTimerEvent *event)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  QWidget *pQVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  State SVar10;
  uint uVar11;
  long in_FS_OFFSET;
  undefined1 local_68 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(int *)(event + 0x10) == *(int *)(lVar3 + 0x5f8)) {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x268))(this);
    QBasicTimer::stop();
    local_68 = ZEXT816(0xffffffffffffffff) << 0x40;
    lVar4 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
    uVar1 = *(undefined8 *)(lVar4 + 0x1c);
    uVar2 = *(undefined8 *)(lVar4 + 0x14);
    uVar11 = *(uint *)(lVar3 + 0x610);
    while( true ) {
      uVar11 = uVar11 - 1;
      if ((int)uVar11 < 0) break;
      iVar9 = *(int *)(*(long *)(lVar3 + 0x608) + (ulong)(uVar11 & 0x7fffffff) * 4);
      uVar8 = columnViewportPosition(this,iVar9);
      bVar6 = QWidget::isRightToLeft((QWidget *)this);
      if (bVar6) {
        iVar9 = columnWidth(this,iVar9);
        local_48.x1.m_i = 0;
        local_48.y1.m_i = 0;
        local_48.x2.m_i = iVar9 + uVar8 + -1;
      }
      else {
        local_48.y1.m_i = 0;
        local_48.x1.m_i = uVar8;
        local_48.x2.m_i = (int)uVar1 - (int)uVar2;
      }
      local_48.y2.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
      QRect::operator|=((QRect *)local_68,&local_48);
    }
    pQVar5 = *(QWidget **)(lVar3 + 0x2b0);
    local_48 = (QRect)QRect::normalized();
    QWidget::update(pQVar5,&local_48);
    QList<int>::clear((QList<int> *)(lVar3 + 0x600));
  }
  else if (*(int *)(event + 0x10) == *(int *)(lVar3 + 0x61c)) {
    pQVar5 = *(QWidget **)(lVar3 + 0x2b0);
    local_68._0_8_ = QCursor::pos();
    local_48._0_8_ = QWidget::mapFromGlobal(pQVar5,(QPoint *)local_68);
    SVar10 = QAbstractItemView::state((QAbstractItemView *)this);
    if (SVar10 == DraggingState) {
      local_68 = (undefined1  [16])QWidget::rect(*(QWidget **)(lVar3 + 0x2b0));
      cVar7 = QRect::contains((QPoint *)local_68,SUB81(&local_48,0));
      if (cVar7 != '\0') {
        local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x1f0))
                  ((QModelIndex *)local_68,this,&local_48);
        expand(this,(QModelIndex *)local_68);
      }
    }
    QBasicTimer::stop();
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::timerEvent(QTimerEvent *event)
{
    Q_D(QTreeView);
    if (event->id() == d->columnResizeTimer.id()) {
        updateGeometries();
        d->columnResizeTimer.stop();
        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        for (int i = d->columnsToUpdate.size() - 1; i >= 0; --i) {
            int column = d->columnsToUpdate.at(i);
            int x = columnViewportPosition(column);
            if (isRightToLeft())
                rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
            else
                rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
        }
        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    } else if (event->timerId() == d->openTimer.timerId()) {
        QPoint pos = d->viewport->mapFromGlobal(QCursor::pos());
        if (state() == QAbstractItemView::DraggingState
            && d->viewport->rect().contains(pos)) {
            QModelIndex index = indexAt(pos);
            expand(index);
        }
        d->openTimer.stop();
    }

    QAbstractItemView::timerEvent(event);
}